

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RowSetEntry * rowSetEntryMerge(RowSetEntry *pA,RowSetEntry *pB)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pTail;
  RowSetEntry head;
  RowSetEntry *pB_local;
  RowSetEntry *pA_local;
  
  pTail = &head;
  pRVar1 = pB;
  pA_local = pA;
  do {
    while (pB_local = pRVar1, pB_local->v < pA_local->v) {
      pTail->pRight = pB_local;
      pTail = pB_local;
      pRVar1 = pB_local->pRight;
      if (pB_local->pRight == (RowSetEntry *)0x0) {
        pB_local->pRight = pA_local;
        return head.pRight;
      }
    }
    if (pA_local->v < pB_local->v) {
      pTail->pRight = pA_local;
      pTail = pA_local;
    }
    pA_local = pA_local->pRight;
    pRVar1 = pB_local;
  } while (pA_local != (RowSetEntry *)0x0);
  pTail->pRight = pB_local;
  return head.pRight;
}

Assistant:

static struct RowSetEntry *rowSetEntryMerge(
  struct RowSetEntry *pA,    /* First sorted list to be merged */
  struct RowSetEntry *pB     /* Second sorted list to be merged */
){
  struct RowSetEntry head;
  struct RowSetEntry *pTail;

  pTail = &head;
  assert( pA!=0 && pB!=0 );
  for(;;){
    assert( pA->pRight==0 || pA->v<=pA->pRight->v );
    assert( pB->pRight==0 || pB->v<=pB->pRight->v );
    if( pA->v<=pB->v ){
      if( pA->v<pB->v ) pTail = pTail->pRight = pA;
      pA = pA->pRight;
      if( pA==0 ){
        pTail->pRight = pB;
        break;
      }
    }else{
      pTail = pTail->pRight = pB;
      pB = pB->pRight;
      if( pB==0 ){
        pTail->pRight = pA;
        break;
      }
    }
  }
  return head.pRight;
}